

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

tpname_t *
tpname_add(tpname_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,node_t_conflict id,
          node_t_conflict scope,int typedef_p)

{
  tpname_t el;
  tpname_t el_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  tpname_t tpname;
  undefined4 uStack_14;
  tpname_t *ptVar2;
  
  el._20_4_ = uStack_14;
  el.typedef_p = typedef_p;
  el.scope = scope;
  el.id = id;
  iVar1 = HTAB_tpname_t_do((HTAB_tpname_t *)c2m_ctx->env[0].__jmpbuf[2],el,HTAB_FIND,
                           __return_storage_ptr__);
  ptVar2 = (tpname_t *)CONCAT44(extraout_var,iVar1);
  if (iVar1 == 0) {
    el_00._20_4_ = uStack_14;
    el_00.typedef_p = typedef_p;
    el_00.scope = scope;
    el_00.id = id;
    iVar1 = HTAB_tpname_t_do((HTAB_tpname_t *)c2m_ctx->env[0].__jmpbuf[2],el_00,HTAB_INSERT,
                             __return_storage_ptr__);
    ptVar2 = (tpname_t *)CONCAT44(extraout_var_00,iVar1);
  }
  return ptVar2;
}

Assistant:

static tpname_t tpname_add (c2m_ctx_t c2m_ctx, node_t id, node_t scope, int typedef_p) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  tpname_t el, tpname;

  tpname.id = id;
  tpname.scope = scope;
  tpname.typedef_p = typedef_p;
  if (HTAB_DO (tpname_t, tpname_tab, tpname, HTAB_FIND, el)) return el;
  HTAB_DO (tpname_t, tpname_tab, tpname, HTAB_INSERT, el);
  return el;
}